

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CombineAccessChains::CombineIndices
          (CombineAccessChains *this,Instruction *ptr_input,Instruction *inst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *new_operands)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> __l;
  Instruction *pIVar1;
  ConstantManager *pCVar2;
  DefUseManager *this_00;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *insert_before;
  bool bVar3;
  uint32_t uVar4;
  Op OVar5;
  uint32_t uVar6;
  int iVar7;
  Analysis preserved_analyses;
  uint32_t op2;
  IRContext *pIVar8;
  Type *type_00;
  Constant *c;
  undefined4 extraout_var;
  bool local_14d;
  uint32_t local_14c;
  iterator local_148;
  undefined8 local_140;
  SmallVector<unsigned_int,_2UL> local_138;
  Operand local_110;
  Instruction *local_e0;
  Instruction *addition;
  InstructionBuilder builder;
  Instruction *new_value_inst;
  iterator local_a8;
  size_type local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Constant *local_80;
  Constant *new_value_constant;
  Type *pTStack_70;
  uint32_t new_value;
  Type *type;
  uint32_t new_value_id;
  bool combining_element_operands;
  Constant *element_constant;
  Instruction *element_inst;
  Constant *last_index_constant;
  Instruction *last_index_inst;
  ConstantManager *constant_mgr;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *new_operands_local;
  Instruction *inst_local;
  Instruction *ptr_input_local;
  CombineAccessChains *this_local;
  
  def_use_mgr = (DefUseManager *)new_operands;
  new_operands_local =
       (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)inst;
  inst_local = ptr_input;
  ptr_input_local = (Instruction *)this;
  pIVar8 = Pass::context(&this->super_Pass);
  constant_mgr = (ConstantManager *)IRContext::get_def_use_mgr(pIVar8);
  pIVar8 = Pass::context(&this->super_Pass);
  last_index_inst = (Instruction *)IRContext::get_constant_mgr(pIVar8);
  pIVar1 = inst_local;
  pCVar2 = constant_mgr;
  uVar4 = Instruction::NumInOperands(inst_local);
  uVar4 = Instruction::GetSingleWordInOperand(pIVar1,uVar4 - 1);
  last_index_constant = (Constant *)analysis::DefUseManager::GetDef((DefUseManager *)pCVar2,uVar4);
  element_inst = (Instruction *)
                 analysis::ConstantManager::GetConstantFromInst
                           ((ConstantManager *)last_index_inst,(Instruction *)last_index_constant);
  pCVar2 = constant_mgr;
  uVar4 = Instruction::GetSingleWordInOperand((Instruction *)new_operands_local,1);
  element_constant = (Constant *)analysis::DefUseManager::GetDef((DefUseManager *)pCVar2,uVar4);
  _new_value_id =
       analysis::ConstantManager::GetConstantFromInst
                 ((ConstantManager *)last_index_inst,(Instruction *)element_constant);
  OVar5 = Instruction::opcode((Instruction *)new_operands_local);
  bVar3 = IsPtrAccessChain(this,OVar5);
  local_14d = false;
  if (bVar3) {
    OVar5 = Instruction::opcode(inst_local);
    bVar3 = IsPtrAccessChain(this,OVar5);
    local_14d = false;
    if (bVar3) {
      uVar4 = Instruction::NumInOperands(inst_local);
      local_14d = uVar4 == 2;
    }
  }
  type._7_1_ = local_14d;
  type._0_4_ = 0;
  pTStack_70 = GetIndexedType(this,inst_local);
  if ((element_inst == (Instruction *)0x0) || (_new_value_id == (Constant *)0x0)) {
    iVar7 = (*pTStack_70->_vptr_Type[0x1c])();
    if ((CONCAT44(extraout_var,iVar7) != 0) && ((type._7_1_ & 1) == 0)) {
      return false;
    }
    pIVar8 = Pass::context(&this->super_Pass);
    insert_before = new_operands_local;
    preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&addition,pIVar8,(Instruction *)insert_before,
               preserved_analyses);
    uVar4 = Instruction::type_id((Instruction *)last_index_constant);
    uVar6 = Instruction::result_id((Instruction *)last_index_constant);
    op2 = Instruction::result_id((Instruction *)element_constant);
    local_e0 = InstructionBuilder::AddIAdd((InstructionBuilder *)&addition,uVar4,uVar6,op2);
    type._0_4_ = Instruction::result_id(local_e0);
  }
  else {
    uVar4 = GetConstantValue(this,(Constant *)element_inst);
    uVar6 = GetConstantValue(this,_new_value_id);
    pIVar1 = last_index_inst;
    new_value_constant._4_4_ = uVar4 + uVar6;
    type_00 = analysis::Constant::type((Constant *)element_inst);
    new_value_inst._4_4_ = new_value_constant._4_4_;
    local_a8 = (iterator)((long)&new_value_inst + 4);
    local_a0 = 1;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&new_value_inst + 3));
    __l._M_len = local_a0;
    __l._M_array = local_a8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_98,__l,(allocator_type *)((long)&new_value_inst + 3));
    c = analysis::ConstantManager::GetConstant((ConstantManager *)pIVar1,type_00,&local_98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&new_value_inst + 3))
    ;
    local_80 = c;
    builder._24_8_ =
         analysis::ConstantManager::GetDefiningInstruction
                   ((ConstantManager *)last_index_inst,c,0,(inst_iterator *)0x0);
    type._0_4_ = Instruction::result_id((Instruction *)builder._24_8_);
  }
  this_00 = def_use_mgr;
  local_14c = (uint32_t)type;
  local_148 = &local_14c;
  local_140 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_148;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_138,init_list);
  Operand::Operand(&local_110,SPV_OPERAND_TYPE_ID,&local_138);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)this_00,
             &local_110);
  Operand::~Operand(&local_110);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_138);
  return true;
}

Assistant:

bool CombineAccessChains::CombineIndices(Instruction* ptr_input,
                                         Instruction* inst,
                                         std::vector<Operand>* new_operands) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::ConstantManager* constant_mgr = context()->get_constant_mgr();

  Instruction* last_index_inst = def_use_mgr->GetDef(
      ptr_input->GetSingleWordInOperand(ptr_input->NumInOperands() - 1));
  const analysis::Constant* last_index_constant =
      constant_mgr->GetConstantFromInst(last_index_inst);

  Instruction* element_inst =
      def_use_mgr->GetDef(inst->GetSingleWordInOperand(1));
  const analysis::Constant* element_constant =
      constant_mgr->GetConstantFromInst(element_inst);

  // Combine the last index of the AccessChain (|ptr_inst|) with the element
  // operand of the PtrAccessChain (|inst|).
  const bool combining_element_operands =
      IsPtrAccessChain(inst->opcode()) &&
      IsPtrAccessChain(ptr_input->opcode()) && ptr_input->NumInOperands() == 2;
  uint32_t new_value_id = 0;
  const analysis::Type* type = GetIndexedType(ptr_input);
  if (last_index_constant && element_constant) {
    // Combine the constants.
    uint32_t new_value = GetConstantValue(last_index_constant) +
                         GetConstantValue(element_constant);
    const analysis::Constant* new_value_constant =
        constant_mgr->GetConstant(last_index_constant->type(), {new_value});
    Instruction* new_value_inst =
        constant_mgr->GetDefiningInstruction(new_value_constant);
    new_value_id = new_value_inst->result_id();
  } else if (!type->AsStruct() || combining_element_operands) {
    // Generate an addition of the two indices.
    InstructionBuilder builder(
        context(), inst,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    Instruction* addition = builder.AddIAdd(last_index_inst->type_id(),
                                            last_index_inst->result_id(),
                                            element_inst->result_id());
    new_value_id = addition->result_id();
  } else {
    // Indexing into structs must be constant, so bail out here.
    return false;
  }
  new_operands->push_back({SPV_OPERAND_TYPE_ID, {new_value_id}});
  return true;
}